

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisReadImmediate(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 id,
                  ZyanU8 size,ZyanBool is_signed,ZyanBool is_relative)

{
  ZyanStatus ZVar1;
  ZydisDecodedInstructionRawImmValue_ ZVar2;
  ZydisDecodedInstructionRawImmValue_ ZVar3;
  ZydisDecodedInstructionRawImmValue_ ZVar4;
  ZydisDecodedInstructionRawImmValue_ ZStack_48;
  ZyanStatus status_047620348_3;
  ZyanU64 value_3;
  uint local_38;
  ZyanStatus status_047620348_2;
  ZyanU32 value_2;
  ZyanStatus status_047620348_1;
  ZyanU16 value_1;
  ZyanStatus status_047620348;
  ZyanU8 value;
  ZyanBool is_relative_local;
  ZyanBool is_signed_local;
  ZyanU8 size_local;
  ZydisDecodedInstruction *pZStack_20;
  ZyanU8 id_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  status_047620348._0_1_ = is_relative;
  status_047620348._1_1_ = is_signed;
  status_047620348._2_1_ = size;
  status_047620348._3_1_ = id;
  pZStack_20 = instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x317,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x318,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((id != '\0') && (id != '\x01')) {
    __assert_fail("(id == 0) || (id == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x319,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((is_signed == '\0') && (is_relative != '\0')) {
    __assert_fail("is_signed || !is_relative",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31a,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((instruction->raw).imm[id].size != '\0') {
    __assert_fail("instruction->raw.imm[id].size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31b,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  (instruction->raw).imm[id].size = size;
  (instruction->raw).imm[id].offset = instruction->length;
  (instruction->raw).imm[id].is_signed = is_signed;
  (instruction->raw).imm[id].is_relative = is_relative;
  if (size == '\b') {
    ZVar1 = ZydisInputNext(state,instruction,(ZyanU8 *)((long)&value_1 + 1));
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    if (status_047620348._1_1_ == '\0') {
      ZVar2.u._1_7_ = 0;
      ZVar2.s._0_1_ = value_1._1_1_;
      (pZStack_20->raw).imm[status_047620348._3_1_].value = ZVar2;
    }
    else {
      (pZStack_20->raw).imm[status_047620348._3_1_].value =
           (ZydisDecodedInstructionRawImmValue_)(long)(char)value_1._1_1_;
    }
  }
  else if (size == '\x10') {
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)((long)&value_2 + 2),'\x02');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    if (status_047620348._1_1_ == '\0') {
      ZVar3.u._2_6_ = 0;
      ZVar3.s._0_2_ = value_2._2_2_;
      (pZStack_20->raw).imm[status_047620348._3_1_].value = ZVar3;
    }
    else {
      (pZStack_20->raw).imm[status_047620348._3_1_].value =
           (ZydisDecodedInstructionRawImmValue_)(long)(short)value_2._2_2_;
    }
  }
  else if (size == ' ') {
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&local_38,'\x04');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    if (status_047620348._1_1_ == '\0') {
      ZVar4.u._4_4_ = 0;
      ZVar4.s._0_4_ = local_38;
      (pZStack_20->raw).imm[status_047620348._3_1_].value = ZVar4;
    }
    else {
      (pZStack_20->raw).imm[status_047620348._3_1_].value =
           (ZydisDecodedInstructionRawImmValue_)(long)(int)local_38;
    }
  }
  else {
    if (size != '@') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x358,
                    "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                   );
    }
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&stack0xffffffffffffffb8,'\b');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    if (status_047620348._1_1_ == '\0') {
      (pZStack_20->raw).imm[status_047620348._3_1_].value = ZStack_48;
    }
    else {
      (pZStack_20->raw).imm[status_047620348._3_1_].value = ZStack_48;
    }
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadImmediate(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 id, ZyanU8 size, ZyanBool is_signed,
    ZyanBool is_relative)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT((id == 0) || (id == 1));
    ZYAN_ASSERT(is_signed || !is_relative);
    ZYAN_ASSERT(instruction->raw.imm[id].size == 0);

    instruction->raw.imm[id].size = size;
    instruction->raw.imm[id].offset = instruction->length;
    instruction->raw.imm[id].is_signed = is_signed;
    instruction->raw.imm[id].is_relative = is_relative;
    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI8)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI16)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI32)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI64)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}